

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O1

cf_void_t hashtbl_remove_node(cf_hashtbl_t *tbl,cf_void_t *key,cf_size_t len)

{
  hashtbl_node **pphVar1;
  hashtbl_node_t *phVar2;
  byte bVar3;
  int iVar4;
  cf_size_t cVar5;
  hashtbl_node_t *__ptr;
  hashtbl_node **pphVar6;
  hashtbl_node_t *phVar7;
  uint uVar8;
  
  if (len == 0xffffffffffffffff) {
    bVar3 = *key;
    if (bVar3 == 0) {
      uVar8 = 0;
      len = 1;
    }
    else {
      uVar8 = 0;
      len = 1;
      do {
        uVar8 = uVar8 * 0x21 + (uint)bVar3;
        bVar3 = *(byte *)((long)key + len);
        len = len + 1;
      } while (bVar3 != 0);
    }
  }
  else if (len == 0) {
    uVar8 = 0;
  }
  else {
    cVar5 = 0;
    uVar8 = 0;
    do {
      uVar8 = (uint)*(byte *)((long)key + cVar5) + uVar8 * 0x21;
      cVar5 = cVar5 + 1;
    } while (len != cVar5);
  }
  uVar8 = uVar8 & tbl->hashmsk;
  phVar2 = tbl->table[uVar8];
  if (phVar2 != (hashtbl_node_t *)0x0) {
    pphVar1 = tbl->table + uVar8;
    phVar7 = (hashtbl_node_t *)0x0;
    do {
      __ptr = phVar2;
      if ((((__ptr->hash == uVar8) && (__ptr->keylen == len)) && (__ptr->key != (void *)0x0)) &&
         (iVar4 = bcmp(__ptr->key,key,len), iVar4 == 0)) {
        pphVar6 = &phVar7->next;
        if (*pphVar1 == __ptr) {
          pphVar6 = pphVar1;
        }
        *pphVar6 = __ptr->next;
        if (tbl->callback != (cf_hashtbl_cb_f)0x0) {
          (*tbl->callback)(__ptr->value);
        }
        free(__ptr->key);
        free(__ptr);
        tbl->size = tbl->size - 1;
        return;
      }
      phVar2 = __ptr->next;
      phVar7 = __ptr;
    } while (__ptr->next != (hashtbl_node *)0x0);
  }
  return;
}

Assistant:

cf_void_t hashtbl_remove_node(cf_hashtbl_t* tbl, const cf_void_t* key, cf_size_t len) {
    cf_uint32_t hash = 0;
    hashtbl_node_t* node = CF_NULL_PTR, **list_entry = CF_NULL_PTR, *prev = CF_NULL_PTR;

    hash = cf_hashtbl_calc_hash(key, &len) & tbl->hashmsk;

    for (list_entry = &tbl->table[hash], node = *list_entry;
         node;
         prev = node, node = node->next) {
        if (node->hash == hash && node->keylen == len
            && node->key != CF_NULL_PTR && memcmp(node->key, key, len) == 0) {
            if (*list_entry == node) {
                *list_entry = node->next;
            } else {
                prev->next = node->next;   
            }
            if (tbl->callback) {
                tbl->callback(node->value);
            }
            cf_free_native(node->key);
            cf_free_native(node);

            tbl->size--;
            return;
        }
    }
}